

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pe_crypto.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::encryption_handler::encrypt(encryption_handler *this,char *__block,int __edflag)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  long *plVar4;
  code *pcVar5;
  _List_node_base *__s;
  span<char> *psVar6;
  span<char> *psVar7;
  span<char> *in_RCX;
  long lVar8;
  undefined4 in_register_00000014;
  _List_node_base *p_Var9;
  uint uVar10;
  _List_node_base *p_Var11;
  int iVar12;
  undefined4 uVar13;
  undefined1 auVar14 [8];
  undefined1 local_58 [8];
  alloca_destructor<libtorrent::span<char>_> abufs_destructor;
  
  p_Var9 = (_List_node_base *)CONCAT44(in_register_00000014,__edflag);
  p_Var11 = (_List_node_base *)local_58;
  lVar8 = *(long *)__block;
  uVar10 = *(uint *)(lVar8 + 0x20);
  if (uVar10 == 0x7fffffff) {
    uVar10 = 0x7fffffff;
    __s = p_Var9;
  }
  else {
    abufs_destructor.objects.m_ptr = in_RCX;
    if ((long)in_RCX < 0x101) {
      if ((long)in_RCX < 1) {
        abufs_destructor.objects.m_ptr = (span<char> *)0x0;
        p_Var11 = (_List_node_base *)local_58;
        __s = (_List_node_base *)0x0;
      }
      else {
        p_Var11 = (_List_node_base *)(local_58 + (long)in_RCX * -0x10);
        for (lVar8 = 0; __s = p_Var11, (long)in_RCX * 0x10 != lVar8; lVar8 = lVar8 + 0x10) {
          puVar1 = (undefined8 *)((long)&p_Var11->_M_next + lVar8);
          *puVar1 = 0;
          puVar1[1] = 0;
        }
      }
    }
    else {
      __s = (_List_node_base *)
            operator_new__(-(ulong)((ulong)in_RCX >> 0x3c != 0) | (long)in_RCX << 4);
      memset(__s,0,(long)in_RCX << 4);
      p_Var11 = (_List_node_base *)local_58;
    }
    local_58 = (undefined1  [8])__s;
    psVar6 = (span<char> *)0x0;
    if ((long)in_RCX < 1) {
      in_RCX = psVar6;
    }
    p_Var11[-1]._M_prev = (_List_node_base *)0x8;
    lVar8 = (long)p_Var11[-1]._M_prev;
    for (; (psVar7 = psVar6, 0 < (int)uVar10 && (psVar7 = in_RCX, in_RCX != psVar6));
        psVar6 = (span<char> *)((long)&psVar6->m_ptr + 1)) {
      uVar2 = *(undefined8 *)((long)p_Var9 + lVar8 + -8);
      uVar3 = *(undefined8 *)((long)&p_Var9->_M_next + lVar8);
      iVar12 = (int)uVar3;
      if ((int)uVar10 < iVar12) {
        *(undefined8 *)((long)__s + lVar8 + -8) = uVar2;
        *(ulong *)((long)&__s->_M_next + lVar8) = (ulong)uVar10;
        uVar10 = 0;
      }
      else {
        *(undefined8 *)((long)__s + lVar8 + -8) = uVar2;
        *(undefined8 *)((long)&__s->_M_next + lVar8) = uVar3;
        uVar10 = uVar10 - iVar12;
      }
      lVar8 = lVar8 + 0x10;
    }
    in_RCX = (span<char> *)((ulong)psVar7 & 0xffffffff);
    p_Var11[-1]._M_prev = (_List_node_base *)0x34b760;
    alloca_destructor<libtorrent::span<char>_>::~alloca_destructor
              ((alloca_destructor<libtorrent::span<char>_> *)local_58);
    lVar8 = *(long *)__block;
  }
  if (in_RCX == (span<char> *)0x0) {
    auVar14 = (undefined1  [8])0x0;
    p_Var9 = (_List_node_base *)0x0;
    abufs_destructor.objects.m_len._0_4_ = 0;
  }
  else {
    plVar4 = *(long **)(lVar8 + 0x10);
    pcVar5 = *(code **)(*plVar4 + 0x20);
    *(undefined8 *)((long)p_Var11 + -8) = 0x34b786;
    (*pcVar5)(local_58,plVar4,__s,in_RCX);
    lVar8 = *(long *)__block;
    p_Var9 = (_List_node_base *)abufs_destructor.objects.m_ptr;
    auVar14 = local_58;
  }
  uVar13 = (undefined4)abufs_destructor.objects.m_len;
  if (*(int *)(lVar8 + 0x20) != 0x7fffffff) {
    if (uVar10 == 0) {
      if (*(long *)(__block + 0x10) == 1) {
        uVar13 = 0x7fffffff;
      }
      *(undefined8 *)((long)p_Var11 + -8) = 0x34b7ca;
      ::std::__cxx11::
      list<libtorrent::aux::encryption_handler::barrier,_std::allocator<libtorrent::aux::encryption_handler::barrier>_>
      ::pop_front((list<libtorrent::aux::encryption_handler::barrier,_std::allocator<libtorrent::aux::encryption_handler::barrier>_>
                   *)__block);
    }
    else {
      *(uint *)(lVar8 + 0x20) = uVar10;
    }
  }
  (this->m_send_barriers).
  super__List_base<libtorrent::aux::encryption_handler::barrier,_std::allocator<libtorrent::aux::encryption_handler::barrier>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)auVar14;
  (this->m_send_barriers).
  super__List_base<libtorrent::aux::encryption_handler::barrier,_std::allocator<libtorrent::aux::encryption_handler::barrier>_>
  ._M_impl._M_node.super__List_node_base._M_prev = p_Var9;
  *(undefined4 *)
   &(this->m_send_barriers).
    super__List_base<libtorrent::aux::encryption_handler::barrier,_std::allocator<libtorrent::aux::encryption_handler::barrier>_>
    ._M_impl._M_node._M_size = uVar13;
  return;
}

Assistant:

std::tuple<int, span<span<char const>>>
	encryption_handler::encrypt(
		span<span<char>> iovec)
	{
		TORRENT_ASSERT(!m_send_barriers.empty());
		TORRENT_ASSERT(m_send_barriers.front().enc_handler);

		int to_process = m_send_barriers.front().next;

		span<span<char>> bufs;
		bool need_destruct = false;
		if (to_process != INT_MAX)
		{
			TORRENT_ALLOCA(abufs, span<char>, iovec.size());
			bufs = abufs;
			need_destruct = true;
			int num_bufs = 0;
			for (int i = 0; to_process > 0 && i < iovec.size(); ++i)
			{
				++num_bufs;
				int const size = int(iovec[i].size());
				if (to_process < size)
				{
					new (&bufs[i]) span<char>(
						iovec[i].data(), to_process);
					to_process = 0;
				}
				else
				{
					new (&bufs[i]) span<char>(iovec[i]);
					to_process -= size;
				}
			}
			bufs = bufs.first(num_bufs);
		}
		else
		{
			bufs = iovec;
		}

		int next_barrier = 0;
		span<span<char const>> out_iovec;
		if (!bufs.empty())
		{
			std::tie(next_barrier, out_iovec)
				= m_send_barriers.front().enc_handler->encrypt(bufs);
		}

		if (m_send_barriers.front().next != INT_MAX)
		{
			// to_process holds the difference between the size of the buffers
			// and the bytes left to the next barrier
			// if it's zero then pop the barrier
			// otherwise update the number of bytes remaining to the next barrier
			if (to_process == 0)
			{
				if (m_send_barriers.size() == 1)
				{
					// transitioning back to plaintext
					next_barrier = INT_MAX;
				}
				m_send_barriers.pop_front();
			}
			else
			{
				m_send_barriers.front().next = to_process;
			}
		}

#if TORRENT_USE_ASSERTS
		if (next_barrier != INT_MAX && next_barrier != 0)
		{
			int payload = 0;
			for (auto buf : bufs)
				payload += int(buf.size());

			int overhead = 0;
			for (auto buf : out_iovec)
				overhead += int(buf.size());
			TORRENT_ASSERT(overhead + payload == next_barrier);
		}
#endif
		if (need_destruct)
		{
			for (auto buf : bufs)
				buf.~span<char>();
		}
		return std::make_tuple(next_barrier, out_iovec);
	}